

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpub.c
# Opt level: O0

int nn_xpub_create(void *hint,nn_sockbase **sockbase)

{
  nn_xpub *self_00;
  nn_xpub *self;
  nn_sockbase **sockbase_local;
  void *hint_local;
  
  self_00 = (nn_xpub *)nn_alloc_(0x28);
  if (self_00 == (nn_xpub *)0x0) {
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pubsub/xpub.c"
            ,0xb6);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_xpub_init(self_00,&nn_xpub_sockbase_vfptr,hint);
  *sockbase = (nn_sockbase *)self_00;
  return 0;
}

Assistant:

int nn_xpub_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_xpub *self;

    self = nn_alloc (sizeof (struct nn_xpub), "socket (xpub)");
    alloc_assert (self);
    nn_xpub_init (self, &nn_xpub_sockbase_vfptr, hint);
    *sockbase = &self->sockbase;

    return 0;
}